

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

bool nite::mousePressed(uint Button)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  
  uVar3 = Button - 0xc9;
  if (uVar3 < 4) {
    if (isbuttonStatePressed[uVar3] != false) {
      return true;
    }
    if (buttonStatePressed[uVar3] == true) {
      bVar1 = false;
      if (buttonState[uVar3] != false) {
        return false;
      }
    }
    else {
      if (buttonState[uVar3] == false) goto LAB_00187333;
      isbuttonStatePressed[uVar3] = true;
      bVar1 = true;
    }
    bVar2 = buttonStatePressed[uVar3] ^ 1;
    buttonStatePressed[uVar3] = bVar1;
  }
  else {
LAB_00187333:
    bVar2 = 0;
  }
  return (bool)bVar2;
}

Assistant:

bool nite::mousePressed(unsigned Button){
	Button -= 201;
	if (Button >= niteButtonsn){
		return 0;
	}

	if (isbuttonStatePressed[Button]){
		return 1;
	}

	if (buttonStatePressed[Button] and buttonState[Button]){
		return 0;
	}

	if (buttonStatePressed[Button]){
		buttonStatePressed[Button] = 0;
		return 0;
	}

	if (!buttonStatePressed[Button] and buttonState[Button]){
		isbuttonStatePressed[Button] = 1;
		buttonStatePressed[Button] = 1;
		return 1;
	}

	return 0;
}